

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O1

void __thiscall
deqp::gls::ShaderExecUtil::TessEvaluationExecutor::~TessEvaluationExecutor
          (TessEvaluationExecutor *this)

{
  TessControlExecutor::~TessControlExecutor((TessControlExecutor *)this);
  operator_delete(this,0x170);
  return;
}

Assistant:

BufferIoExecutor::~BufferIoExecutor (void)
{
}